

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O1

sockaddr_in *
mdns_record_parse_a(void *buffer,size_t size,size_t offset,size_t length,sockaddr_in *addr)

{
  addr->sin_family = 0;
  addr->sin_port = 0;
  addr->sin_addr = 0;
  addr->sin_zero[0] = '\0';
  addr->sin_zero[1] = '\0';
  addr->sin_zero[2] = '\0';
  addr->sin_zero[3] = '\0';
  addr->sin_zero[4] = '\0';
  addr->sin_zero[5] = '\0';
  addr->sin_zero[6] = '\0';
  addr->sin_zero[7] = '\0';
  addr->sin_family = 2;
  if (length == 4 && length + offset <= size) {
    (addr->sin_addr).s_addr = *(in_addr_t *)((long)buffer + offset);
  }
  return addr;
}

Assistant:

struct sockaddr_in*
mdns_record_parse_a(const void* buffer, size_t size, size_t offset, size_t length,
                    struct sockaddr_in* addr) {
	memset(addr, 0, sizeof(struct sockaddr_in));
	addr->sin_family = AF_INET;
#ifdef __APPLE__
	addr->sin_len = sizeof(struct sockaddr_in);
#endif
	if ((size >= offset + length) && (length == 4))
		addr->sin_addr.s_addr = *(const uint32_t*)((const char*)buffer + offset);
	return addr;
}